

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateScriptRequest,cfd::js::api::json::ScriptDataResponse,cfd::js::api::CreateScriptRequestStruct,cfd::js::api::ScriptDataResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateScriptRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  ScriptDataResponseStruct response;
  CreateScriptRequestStruct request;
  ScriptDataResponse res;
  CreateScriptRequest req;
  string local_260;
  ScriptDataResponseStruct local_240;
  CreateScriptRequestStruct local_178;
  ErrorResponse local_130;
  CreateScriptRequest local_78;
  
  CreateScriptRequest::CreateScriptRequest(&local_78);
  core::JsonClassBase<cfd::js::api::json::CreateScriptRequest>::Deserialize
            (&local_78.super_JsonClassBase<cfd::js::api::json::CreateScriptRequest>,(string *)this);
  CreateScriptRequest::ConvertToStruct(&local_178,&local_78);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_240,request_message,&local_178);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_240.error.code == 0) {
      ScriptDataResponse::ScriptDataResponse((ScriptDataResponse *)&local_130);
      ScriptDataResponse::ConvertFromStruct((ScriptDataResponse *)&local_130,&local_240);
      core::JsonClassBase<cfd::js::api::json::ScriptDataResponse>::Serialize_abi_cxx11_
                (&local_260,(JsonClassBase<cfd::js::api::json::ScriptDataResponse> *)&local_130);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      ScriptDataResponse::~ScriptDataResponse((ScriptDataResponse *)&local_130);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_130,&local_240.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_260,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_130);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_130.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a78a38;
      InnerErrorResponse::~InnerErrorResponse(&local_130.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_130.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_240.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_240.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.error.message._M_dataplus._M_p != &local_240.error.message.field_2) {
      operator_delete(local_240.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.error.type._M_dataplus._M_p != &local_240.error.type.field_2) {
      operator_delete(local_240.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.hex._M_dataplus._M_p != &local_240.hex.field_2) {
      operator_delete(local_240.hex._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_178.ignore_items._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178.items);
    local_78.super_JsonClassBase<cfd::js::api::json::CreateScriptRequest>._vptr_JsonClassBase =
         (_func_int **)&PTR__CreateScriptRequest_00a7c8f8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78.items_.
               super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_78.ignore_items._M_t);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  ScriptDataResponse::~ScriptDataResponse((ScriptDataResponse *)&local_130);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  ScriptDataResponseStruct::~ScriptDataResponseStruct(&local_240);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_178.ignore_items._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.items);
  local_78.super_JsonClassBase<cfd::js::api::json::CreateScriptRequest>._vptr_JsonClassBase =
       (_func_int **)&PTR__CreateScriptRequest_00a7c8f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78.items_.
             super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_78.ignore_items._M_t);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}